

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_t * cmd_ln_init(cmd_ln_t *inout_cmdln,arg_t *defn,int32 strict,...)

{
  char in_AL;
  uint uVar1;
  char **argv;
  char *pcVar2;
  void **ppvVar3;
  cmd_ln_t *pcVar4;
  undefined8 in_RCX;
  void **ppvVar5;
  void **ppvVar6;
  ulong uVar7;
  long lVar8;
  size_t n_elem;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 uVar9;
  ulong uVar10;
  void **ppvVar11;
  void **ppvVar12;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  ppvVar12 = local_e8;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ppvVar6 = &args[0].overflow_arg_area;
  uVar9 = 0x3000000018;
  uVar1 = 0x18;
  n_elem = 0;
  ppvVar11 = ppvVar6;
  while( true ) {
    if (uVar1 < 0x29) {
      uVar10 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),uVar1);
      ppvVar5 = (void **)((long)ppvVar12 + uVar10);
      ppvVar3 = ppvVar6;
    }
    else {
      ppvVar3 = ppvVar6 + 1;
      ppvVar5 = ppvVar6;
      ppvVar11 = ppvVar3;
    }
    if (*ppvVar5 == (void *)0x0) {
      argv = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                     ,0x2d9);
      uVar10 = 0x3000000018;
      ppvVar6 = &args[0].overflow_arg_area;
      lVar8 = 0;
      while( true ) {
        uVar7 = uVar10 & 0xffffffff;
        if (uVar7 < 0x29) {
          uVar10 = (ulong)((int)uVar10 + 8);
          ppvVar3 = (void **)((long)ppvVar12 + uVar7);
          ppvVar11 = ppvVar6;
        }
        else {
          ppvVar11 = ppvVar6 + 1;
          ppvVar3 = ppvVar6;
        }
        if ((char *)*ppvVar3 == (char *)0x0) break;
        pcVar2 = __ckd_salloc__((char *)*ppvVar3,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                ,0x2dd);
        argv[lVar8] = pcVar2;
        uVar7 = uVar10 & 0xffffffff;
        if (uVar7 < 0x29) {
          uVar10 = (ulong)((int)uVar10 + 8);
          ppvVar3 = (void **)((long)ppvVar12 + uVar7);
          ppvVar6 = ppvVar11;
        }
        else {
          ppvVar6 = ppvVar11 + 1;
          ppvVar3 = ppvVar11;
        }
        pcVar2 = __ckd_salloc__((char *)*ppvVar3,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                ,0x2e0);
        argv[lVar8 + 1] = pcVar2;
        lVar8 = lVar8 + 2;
      }
      pcVar4 = parse_options(inout_cmdln,defn,(int32)lVar8,argv,strict);
      return pcVar4;
    }
    if (uVar1 < 0x29) {
      uVar10 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),uVar1);
      ppvVar6 = ppvVar3;
      ppvVar3 = (void **)((long)ppvVar12 + uVar10);
    }
    else {
      ppvVar6 = ppvVar3 + 1;
      ppvVar11 = ppvVar6;
    }
    if (*ppvVar3 == (void *)0x0) break;
    n_elem = n_elem + 2;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
          ,0x2d1,"Number of arguments must be even!\n",in_R8,in_R9,uVar9,ppvVar11,ppvVar12);
  return (cmd_ln_t *)0x0;
}

Assistant:

cmd_ln_t *
cmd_ln_init(cmd_ln_t *inout_cmdln, const arg_t *defn, int32 strict, ...)
{
    va_list args;
    const char *arg, *val;
    char **f_argv;
    int32 f_argc;

    va_start(args, strict);
    f_argc = 0;
    while ((arg = va_arg(args, const char *))) {
        ++f_argc;
        val = va_arg(args, const char*);
        if (val == NULL) {
            E_ERROR("Number of arguments must be even!\n");
            return NULL;
        }
        ++f_argc;
    }
    va_end(args);

    /* Now allocate f_argv */
    f_argv = (char**)ckd_calloc(f_argc, sizeof(*f_argv));
    va_start(args, strict);
    f_argc = 0;
    while ((arg = va_arg(args, const char *))) {
        f_argv[f_argc] = ckd_salloc(arg);
        ++f_argc;
        val = va_arg(args, const char*);
        f_argv[f_argc] = ckd_salloc(val);
        ++f_argc;
    }
    va_end(args);

    return parse_options(inout_cmdln, defn, f_argc, f_argv, strict);
}